

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O2

void absl::lts_20250127::base_internal::ThrowStdRuntimeError(char *what_arg)

{
  runtime_error *this;
  
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,what_arg);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ThrowStdRuntimeError(const char* what_arg) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw std::runtime_error(what_arg);
#else
  ABSL_RAW_LOG(FATAL, "%s", what_arg);
  std::abort();
#endif
}